

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::
     verifyInteger<8u,8u,8u,8u,unsigned_int>
               (GLint original_value,GLint positive_value,GLint negated_value)

{
  uint uVar1;
  uint uVar2;
  Integer<unsigned_int,_8U,_24U> local_38;
  Integer<unsigned_int,_8U,_24U> local_34;
  Integer<unsigned_int,_8U,_24U> negated_alpha;
  Integer<unsigned_int,_8U,_24U> positive_alpha;
  Integer<unsigned_int,_8U,_16U> negated_blue;
  Integer<unsigned_int,_8U,_16U> positive_blue;
  Integer<unsigned_int,_8U,_8U> negated_green;
  Integer<unsigned_int,_8U,_8U> positive_green;
  Integer<unsigned_int,_8U,_0U> negated_red;
  Integer<unsigned_int,_8U,_0U> positive_red;
  GLint negated_value_local;
  GLint positive_value_local;
  GLint original_value_local;
  
  if (original_value == positive_value) {
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<unsigned_int,_8U,_0U>::
    Integer((Integer<unsigned_int,_8U,_0U> *)&positive_green,positive_value);
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<unsigned_int,_8U,_0U>::
    Integer((Integer<unsigned_int,_8U,_0U> *)&negated_green,negated_value);
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<unsigned_int,_8U,_8U>::
    Integer((Integer<unsigned_int,_8U,_8U> *)&positive_blue,positive_value);
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<unsigned_int,_8U,_8U>::
    Integer((Integer<unsigned_int,_8U,_8U> *)&negated_blue,negated_value);
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<unsigned_int,_8U,_16U>::
    Integer((Integer<unsigned_int,_8U,_16U> *)&positive_alpha,positive_value);
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<unsigned_int,_8U,_16U>::
    Integer((Integer<unsigned_int,_8U,_16U> *)&negated_alpha,negated_value);
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<unsigned_int,_8U,_24U>::
    Integer(&local_34,positive_value);
    gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<unsigned_int,_8U,_24U>::
    Integer(&local_38,negated_value);
    uVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::
            Integer<unsigned_int,_8U,_0U>::GetNegated
                      ((Integer<unsigned_int,_8U,_0U> *)&positive_green);
    uVar2 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::
            Integer<unsigned_int,_8U,_0U>::Get((Integer<unsigned_int,_8U,_0U> *)&negated_green);
    if (uVar1 == uVar2) {
      uVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::
              Integer<unsigned_int,_8U,_16U>::GetNegated
                        ((Integer<unsigned_int,_8U,_16U> *)&positive_alpha);
      uVar2 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::
              Integer<unsigned_int,_8U,_16U>::Get((Integer<unsigned_int,_8U,_16U> *)&negated_alpha);
      if (uVar1 == uVar2) {
        uVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::
                Integer<unsigned_int,_8U,_8U>::GetNegated
                          ((Integer<unsigned_int,_8U,_8U> *)&positive_blue);
        uVar2 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::
                Integer<unsigned_int,_8U,_8U>::Get((Integer<unsigned_int,_8U,_8U> *)&negated_blue);
        if (uVar1 == uVar2) {
          uVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::
                  Integer<unsigned_int,_8U,_24U>::GetNegated(&local_34);
          uVar2 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::
                  Integer<unsigned_int,_8U,_24U>::Get(&local_38);
          if (uVar1 == uVar2) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool verifyInteger(GLint original_value, GLint positive_value, GLint negated_value)
	{
		if (original_value != positive_value)
		{
			return false;
		}

		Integer<T, R, 0> positive_red(positive_value);
		Integer<T, R, 0> negated_red(negated_value);

		Integer<T, G, R> positive_green(positive_value);
		Integer<T, G, R> negated_green(negated_value);

		Integer<T, B, R + G> positive_blue(positive_value);
		Integer<T, B, R + G> negated_blue(negated_value);

		Integer<T, A, R + G + B> positive_alpha(positive_value);
		Integer<T, A, R + G + B> negated_alpha(negated_value);

		if (((0 != R) && (positive_red.GetNegated() != negated_red.Get())) ||
			((0 != B) && (positive_blue.GetNegated() != negated_blue.Get())) ||
			((0 != G) && (positive_green.GetNegated() != negated_green.Get())) ||
			((0 != A) && (positive_alpha.GetNegated() != negated_alpha.Get())))
		{
			return false;
		}

		return true;
	}